

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O1

bool __thiscall
FIX::SocketAcceptor::onData(SocketAcceptor *this,SocketServer *server,socket_handle s)

{
  _Rb_tree_header *__nbytes;
  ssize_t sVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  
  __nbytes = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &__nbytes->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < s]) {
    if (s <= (int)p_Var3[1]._M_color) {
      p_Var2 = p_Var3;
    }
  }
  p_Var3 = &__nbytes->_M_header;
  if (((_Rb_tree_header *)p_Var2 != __nbytes) && (p_Var3 = p_Var2, s < (int)p_Var2[1]._M_color)) {
    p_Var3 = &__nbytes->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 != __nbytes) {
    sVar1 = SocketConnection::read
                      ((SocketConnection *)p_Var3[1]._M_parent,(int)this,server,(size_t)__nbytes);
    return SUB81(sVar1,0);
  }
  return false;
}

Assistant:

bool SocketAcceptor::onData(SocketServer &server, socket_handle s) {
  SocketConnections::iterator i = m_connections.find(s);
  if (i == m_connections.end()) {
    return false;
  }
  SocketConnection *pSocketConnection = i->second;
  return pSocketConnection->read(*this, server);
}